

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

ion_dictionary_compare_t dictionary_switch_compare(ion_key_type_t key_type)

{
  ion_dictionary_compare_t local_18;
  ion_dictionary_compare_t compare;
  ion_key_type_t key_type_local;
  
  switch(key_type) {
  case key_type_numeric_signed:
    local_18 = dictionary_compare_signed_value;
    break;
  case key_type_numeric_unsigned:
    local_18 = dictionary_compare_unsigned_value;
    break;
  case key_type_char_array:
    local_18 = dictionary_compare_char_array;
    break;
  case key_type_null_terminated_string:
    local_18 = dictionary_compare_null_terminated_string;
  }
  return local_18;
}

Assistant:

ion_dictionary_compare_t
dictionary_switch_compare(
	ion_key_type_t key_type
) {
	ion_dictionary_compare_t compare;

	switch (key_type) {
		case key_type_numeric_signed: {
			compare = dictionary_compare_signed_value;
			break;
		}

		case key_type_numeric_unsigned: {
			compare = dictionary_compare_unsigned_value;
			break;
		}

		case key_type_char_array: {
			compare = dictionary_compare_char_array;
			break;
		}

		case key_type_null_terminated_string: {
			compare = dictionary_compare_null_terminated_string;
			break;
		}

		default: {
			/* do something - you must bind the correct comparison function */
			break;
		}
	}

	return compare;
}